

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QDockAreaLayoutItem>::assign<QDockAreaLayoutItem_const*,q20::identity>
          (QArrayDataPointer<QDockAreaLayoutItem> *this,QDockAreaLayoutItem *first,
          QDockAreaLayoutItem *last)

{
  Data *pDVar1;
  QDockAreaLayoutItem *this_00;
  QDockAreaLayoutItem *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  QDockAreaLayoutItem *__cur;
  QDockAreaLayoutItem *pQVar6;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QDockAreaLayoutItem> local_58;
  QArrayData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (long)last - (long)first >> 3;
  lVar4 = lVar3 * -0x3333333333333333;
  pDVar1 = this->d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00444260:
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    if (pDVar1 != (Data *)0x0) {
      lVar5 = (pDVar1->super_QArrayData).alloc;
      if (lVar5 == lVar4 || SBORROW8(lVar5,lVar4) != lVar5 + lVar3 * 0x3333333333333333 < 0) {
        lVar5 = lVar4;
      }
      if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
        lVar4 = lVar5;
      }
    }
    local_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QDockAreaLayoutItem *)QArrayData::allocate(&local_40,0x28,0x10,lVar4,KeepSize);
    local_58.d = this->d;
    local_58.ptr = this->ptr;
    this->d = (Data *)local_40;
    this->ptr = pQVar2;
    local_58.size = this->size;
    this->size = 0;
    ~QArrayDataPointer(&local_58);
  }
  else {
    if (pDVar1 == (Data *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (pDVar1->super_QArrayData).alloc;
    }
    if (lVar4 - lVar5 != 0 && lVar5 <= lVar4) goto LAB_00444260;
  }
  if (this->d == (Data *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = ((long)((long)this->ptr -
                   ((ulong)((long)&this->d[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
            3) * -0x3333333333333333;
  }
  pQVar6 = this->ptr;
  pQVar2 = pQVar6 + -lVar4;
  if (lVar4 != 0) {
    if (this->size != 0) {
      lVar4 = this->size * 0x28;
      do {
        QDockAreaLayoutItem::~QDockAreaLayoutItem(pQVar6);
        pQVar6 = pQVar6 + 1;
        lVar4 = lVar4 + -0x28;
      } while (lVar4 != 0);
    }
    this->size = 0;
    this->ptr = pQVar2;
  }
  lVar4 = this->size;
  pQVar6 = this->ptr;
  for (; this_00 = pQVar2, first != last; first = first + 1) {
    if (pQVar2 == pQVar6 + lVar4) goto LAB_00444382;
    QDockAreaLayoutItem::operator=(pQVar2,first);
    pQVar2 = pQVar2 + 1;
  }
  for (; this_00 != pQVar6 + lVar4; this_00 = this_00 + 1) {
    QDockAreaLayoutItem::~QDockAreaLayoutItem(this_00);
  }
LAB_004443b5:
  this->size = ((long)pQVar2 - (long)this->ptr >> 3) * -0x3333333333333333;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_00444382:
  do {
    QDockAreaLayoutItem::QDockAreaLayoutItem(pQVar2,first);
    first = first + 1;
    pQVar2 = pQVar2 + 1;
  } while (first != last);
  goto LAB_004443b5;
}

Assistant:

void assign(InputIterator first, InputIterator last, Projection proj = {})
    {
        // This function only provides the basic exception guarantee.
        constexpr bool IsFwdIt = std::is_convertible_v<
                typename std::iterator_traits<InputIterator>::iterator_category,
                std::forward_iterator_tag>;
        constexpr bool IsIdentity = std::is_same_v<Projection, q20::identity>;

        if constexpr (IsFwdIt) {
            const qsizetype n = std::distance(first, last);
            if (needsDetach() || n > constAllocatedCapacity()) {
                QArrayDataPointer allocated(detachCapacity(n));
                swap(allocated);
            }
        } else if (needsDetach()) {
            QArrayDataPointer allocated(allocatedCapacity());
            swap(allocated);
            // We don't want to copy data that we know we'll overwrite
        }

        auto offset = freeSpaceAtBegin();
        const auto capacityBegin = begin() - offset;
        const auto prependBufferEnd = begin();

        if constexpr (!std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
            // If construction can throw, and we have freeSpaceAtBegin(),
            // it's easiest to just clear the container and start fresh.
            // The alternative would be to keep track of two active, disjoint ranges.
            if (offset) {
                (*this)->truncate(0);
                setBegin(capacityBegin);
                offset = 0;
            }
        }

        auto dst = capacityBegin;
        const auto dend = end();
        if (offset) { // avoids dead stores
            setBegin(capacityBegin); // undo prepend optimization

            // By construction, the following loop is nothrow!
            // (otherwise, we can't reach here)
            // Assumes InputIterator operations don't throw.
            // (but we can't statically assert that, as these operations
            //  have preconditons, so typically aren't noexcept)
            while (true) {
                if (dst == prependBufferEnd) {  // ran out of prepend buffer space
                    size += offset;
                    // we now have a contiguous buffer, continue with the main loop:
                    break;
                }
                if (first == last) {            // ran out of elements to assign
                    std::destroy(prependBufferEnd, dend);
                    size = dst - begin();
                    return;
                }
                // construct element in prepend buffer
                q20::construct_at(dst, std::invoke(proj, *first));
                ++dst;
                ++first;
            }
        }

        while (true) {
            if (first == last) {    // ran out of elements to assign
                std::destroy(dst, dend);
                break;
            }
            if (dst == dend) {      // ran out of existing elements to overwrite
                if constexpr (IsFwdIt && IsIdentity) {
                    dst = std::uninitialized_copy(first, last, dst);
                    break;
                } else if constexpr (IsFwdIt && !IsIdentity
                           && std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
                    for (; first != last; ++dst, ++first)   // uninitialized_copy with projection
                        q20::construct_at(dst, std::invoke(proj, *first));
                    break;
                } else {
                    do {
                        (*this)->emplace(size, std::invoke(proj, *first));
                    } while (++first != last);
                    return;         // size() is already correct (and dst invalidated)!
                }
            }
            *dst = std::invoke(proj, *first);    // overwrite existing element
            ++dst;
            ++first;
        }
        size = dst - begin();
    }